

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLinkDistance::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkDistance *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar5 [64];
  ChVector<double> D2rel;
  Quaternion Ql2;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  ChVector<double> D2temp;
  ChVector<double> v;
  undefined1 local_128 [16];
  double local_118;
  ChQuaternion<double> local_108;
  ChVector<double> local_e8;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  ChMatrix33<double> local_78;
  undefined1 auVar4 [64];
  
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)&local_108,(ChFrame<double> *)(this->super_ChLink).Body1,
             &this->pos1);
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_128,(ChFrame<double> *)(this->super_ChLink).Body2,&this->pos2
            );
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
       vsubpd_avx((undefined1  [16])local_108.m_data._0_16_,local_128);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_108.m_data[2] - local_118;
  Vnorm<double>(&local_90,(ChVector<double> *)&local_78);
  ChFrame<double>::TransformDirectionParentToLocal
            ((ChVector<double> *)local_128,(ChFrame<double> *)(this->super_ChLink).Body2,&local_90);
  local_a8.m_data[2] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_e8.m_data[2] = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  XdirToDxDyDz<double>
            ((ChVector<double> *)local_128,(ChVector<double> *)&VECT_Y,&local_a8,&local_c8,&local_e8
            );
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_a8.m_data[2];
  auVar3 = vbroadcastsd_avx512f(auVar1);
  auVar3 = vpermi2pd_avx512f(_DAT_00e79b40,
                             ZEXT2464(CONCAT816(auVar3._16_8_,
                                                CONCAT88(local_a8.m_data[1],local_a8.m_data[0]))),
                             ZEXT1664(CONCAT88(local_c8.m_data[1],local_c8.m_data[0])));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_c8.m_data[2];
  auVar4 = vbroadcastsd_avx512f(auVar2);
  auVar5._0_40_ = auVar3._0_40_;
  auVar5._40_8_ = auVar4._40_8_;
  auVar5._48_8_ = auVar3._48_8_;
  auVar5._56_8_ = auVar3._56_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
       vpermi2pd_avx512f(_DAT_00e79b80,auVar5,
                         ZEXT1664(CONCAT88(local_e8.m_data[1],local_e8.m_data[0])));
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_e8.m_data[2];
  ChMatrix33<double>::Get_A_quaternion(&local_108,&local_78);
  ChCoordsys<double>::ChCoordsys(__return_storage_ptr__,&this->pos2,&local_108);
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkDistance::GetLinkRelativeCoords() {
    ChVector<> D2local;
    ChVector<> D2temp = (Vnorm(Body1->TransformPointLocalToParent(pos1) - Body2->TransformPointLocalToParent(pos2)));
    ChVector<> D2rel = Body2->TransformDirectionParentToLocal(D2temp);
    ChVector<> Vx, Vy, Vz;
    XdirToDxDyDz(D2rel, VECT_Y, Vx, Vy, Vz);
    ChMatrix33<> rel_matrix(Vx, Vy, Vz);

    Quaternion Ql2 = rel_matrix.Get_A_quaternion();
    return ChCoordsys<>(pos2, Ql2);
}